

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

void HUF_sort(nodeElt *huffNode,uint *count,U32 maxSymbolValue,rankPos *rankPosition)

{
  ushort uVar1;
  uint maxSymbolValue1_00;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  int iVar5;
  U32 bucketStartIdx;
  int bucketSize;
  U32 pos;
  U32 r;
  U32 c;
  U32 lowerRank;
  U32 maxSymbolValue1;
  U32 n;
  rankPos *rankPosition_local;
  U32 maxSymbolValue_local;
  uint *count_local;
  nodeElt *huffNode_local;
  
  maxSymbolValue1_00 = maxSymbolValue + 1;
  memset(rankPosition,0,0x300);
  lowerRank = 0;
  while( true ) {
    if (maxSymbolValue1_00 <= lowerRank) {
      if (rankPosition[0xbf].base != 0) {
        __assert_fail("rankPosition[RANK_POSITION_TABLE_SIZE - 1].base == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x264,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)")
        ;
      }
      for (lowerRank = 0xbf; lowerRank != 0; lowerRank = lowerRank - 1) {
        rankPosition[lowerRank - 1].base =
             rankPosition[lowerRank - 1].base + rankPosition[lowerRank].base;
        rankPosition[lowerRank - 1].curr = rankPosition[lowerRank - 1].base;
      }
      lowerRank = 0;
      while( true ) {
        if (maxSymbolValue1_00 <= lowerRank) {
          uVar4 = ZSTD_highbit32(0x9e);
          lowerRank = uVar4 + 0x9e;
          do {
            if (0xbe < lowerRank) {
              iVar5 = HUF_isSorted(huffNode,maxSymbolValue1_00);
              if (iVar5 != 0) {
                return;
              }
              __assert_fail("HUF_isSorted(huffNode, maxSymbolValue1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                            ,0x27f,
                            "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
            }
            iVar5 = (uint)rankPosition[lowerRank].curr - (uint)rankPosition[lowerRank].base;
            if (1 < iVar5) {
              if (maxSymbolValue1_00 <= rankPosition[lowerRank].base) {
                __assert_fail("bucketStartIdx < maxSymbolValue1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                              ,0x27a,
                              "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)"
                             );
              }
              HUF_simpleQuickSort(huffNode + (uint)rankPosition[lowerRank].base,0,iVar5 + -1);
            }
            lowerRank = lowerRank + 1;
          } while( true );
        }
        UVar2 = count[lowerRank];
        UVar3 = HUF_getIndex(UVar2);
        uVar1 = rankPosition[UVar3 + 1].curr;
        rankPosition[UVar3 + 1].curr = uVar1 + 1;
        uVar4 = (uint)uVar1;
        if (maxSymbolValue1_00 <= uVar4) break;
        huffNode[uVar4].count = UVar2;
        huffNode[uVar4].byte = (BYTE)lowerRank;
        lowerRank = lowerRank + 1;
      }
      __assert_fail("pos < maxSymbolValue1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x270,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
    }
    UVar2 = HUF_getIndex(count[lowerRank]);
    if (0xbe < UVar2) break;
    rankPosition[UVar2].base = rankPosition[UVar2].base + 1;
    lowerRank = lowerRank + 1;
  }
  __assert_fail("lowerRank < RANK_POSITION_TABLE_SIZE - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                ,0x260,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
}

Assistant:

static void HUF_sort(nodeElt huffNode[], const unsigned count[], U32 const maxSymbolValue, rankPos rankPosition[]) {
    U32 n;
    U32 const maxSymbolValue1 = maxSymbolValue+1;

    /* Compute base and set curr to base.
     * For symbol s let lowerRank = HUF_getIndex(count[n]) and rank = lowerRank + 1.
     * See HUF_getIndex to see bucketing strategy.
     * We attribute each symbol to lowerRank's base value, because we want to know where
     * each rank begins in the output, so for rank R we want to count ranks R+1 and above.
     */
    ZSTD_memset(rankPosition, 0, sizeof(*rankPosition) * RANK_POSITION_TABLE_SIZE);
    for (n = 0; n < maxSymbolValue1; ++n) {
        U32 lowerRank = HUF_getIndex(count[n]);
        assert(lowerRank < RANK_POSITION_TABLE_SIZE - 1);
        rankPosition[lowerRank].base++;
    }

    assert(rankPosition[RANK_POSITION_TABLE_SIZE - 1].base == 0);
    /* Set up the rankPosition table */
    for (n = RANK_POSITION_TABLE_SIZE - 1; n > 0; --n) {
        rankPosition[n-1].base += rankPosition[n].base;
        rankPosition[n-1].curr = rankPosition[n-1].base;
    }

    /* Insert each symbol into their appropriate bucket, setting up rankPosition table. */
    for (n = 0; n < maxSymbolValue1; ++n) {
        U32 const c = count[n];
        U32 const r = HUF_getIndex(c) + 1;
        U32 const pos = rankPosition[r].curr++;
        assert(pos < maxSymbolValue1);
        huffNode[pos].count = c;
        huffNode[pos].byte  = (BYTE)n;
    }

    /* Sort each bucket. */
    for (n = RANK_POSITION_DISTINCT_COUNT_CUTOFF; n < RANK_POSITION_TABLE_SIZE - 1; ++n) {
        int const bucketSize = rankPosition[n].curr - rankPosition[n].base;
        U32 const bucketStartIdx = rankPosition[n].base;
        if (bucketSize > 1) {
            assert(bucketStartIdx < maxSymbolValue1);
            HUF_simpleQuickSort(huffNode + bucketStartIdx, 0, bucketSize-1);
        }
    }

    assert(HUF_isSorted(huffNode, maxSymbolValue1));
}